

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

void __thiscall
tcu::TestPackageDescriptor::TestPackageDescriptor
          (TestPackageDescriptor *this,char *name,TestPackageCreateFunc createFunc)

{
  TestPackageRegistry *this_00;
  TestPackageCreateFunc createFunc_local;
  char *name_local;
  TestPackageDescriptor *this_local;
  
  this_00 = TestPackageRegistry::getSingleton();
  TestPackageRegistry::registerPackage(this_00,name,createFunc);
  return;
}

Assistant:

TestPackageDescriptor::TestPackageDescriptor (const char* name, TestPackageCreateFunc createFunc)
{
	TestPackageRegistry::getSingleton()->registerPackage(name, createFunc);
}